

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

tests * lest::make_tests<lest::test[3]>(tests *__return_storage_ptr__,test (*c) [3])

{
  test *first;
  test *last;
  tests local_30;
  test (*local_18) [3];
  test (*c_local) [3];
  
  local_18 = c;
  c_local = (test (*) [3])__return_storage_ptr__;
  first = test_begin<lest::test[3]>(c);
  last = test_end<lest::test[3]>(local_18);
  make_tests(&local_30,first,last);
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(__return_storage_ptr__,&local_30);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline int run( tests const & specification, int argc, char ** argv, std::ostream & os = std::cout )
{
    return run( specification, make_texts( argv + 1, argv + argc ), os  );
}